

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O1

void __thiscall
testing::StrictMock<solitaire::archivers::HistoryTrackerMock>::StrictMock
          (StrictMock<solitaire::archivers::HistoryTrackerMock> *this)

{
  Mock::FailUninterestingCalls(this);
  memset(this,0,0x128);
  (this->super_HistoryTrackerMock).super_HistoryTracker._vptr_HistoryTracker =
       (_func_int **)&PTR__HistoryTrackerMock_00321fb0;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock00_reset_10.super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock00_reset_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031e018;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock01_save_11.super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock01_save_11.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00321ff0;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock00_undo_12.super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock00_undo_12.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031e018;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_HistoryTrackerMock).gmock10_getHistorySize_13.
              super_UntypedFunctionMockerBase);
  (this->super_HistoryTrackerMock).gmock10_getHistorySize_13.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00321e58;
  (this->super_HistoryTrackerMock).super_HistoryTracker._vptr_HistoryTracker =
       (_func_int **)&PTR__StrictMock_00321f00;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }